

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O1

int mmu_translate(CPUS390XState_conflict *env,target_ulong vaddr,int rw,uint64_t asc,
                 target_ulong *raddr,int *flags,uint64_t *tec)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  _Bool _Var10;
  bool bVar11;
  MemTxResult MVar12;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  MemoryRegion_conflict *pMVar13;
  ulong *puVar14;
  sbyte sVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  int iVar23;
  hwaddr addr;
  ulong local_70;
  ram_addr_t local_68;
  undefined4 local_5c;
  byte *local_58;
  hwaddr l;
  FlatView *local_48;
  undefined8 local_40;
  ulong *local_38;
  
  uVar22 = vaddr & 0xfffffffffffff000;
  uVar18 = asc >> 0x2e | uVar22 | (ulong)(rw != 1) * 0x400 + 0x400;
  *tec = uVar18;
  *flags = 7;
  uVar21 = (uint)vaddr;
  if ((vaddr < 0x2000) && ((env->cregs[0] & 0x10000000) != 0)) {
    if (((env->psw).mask & 0x400000000000000) != 0) {
      if (asc == 0) {
        lVar19 = 0x378;
      }
      else if (asc == 0xc00000000000) {
        lVar19 = 0x3d8;
      }
      else {
        if (asc != 0x800000000000) {
          exit(1);
        }
        lVar19 = 0x3a8;
      }
      if ((*(byte *)((long)env->regs + lVar19 + 1) & 1) != 0) goto LAB_00cc4efd;
    }
    *flags = 0x47;
    if ((rw == 1) && (vaddr < 0x200 || (uVar21 & 0x1e00) == 0x1000)) {
      *tec = uVar18 | 0x80;
      return 4;
    }
  }
LAB_00cc4efd:
  if (((env->psw).mask & 0x400000000000000) == 0) {
    *raddr = uVar22;
    goto LAB_00cc5673;
  }
  uVar18 = *(ulong *)((long)env->regs + *(long *)(&DAT_00dc88d0 + (asc << 0x12 | asc >> 0x2e) * 8));
  local_58 = (byte *)flags;
  if ((env->cregs[0] & 0x800000) == 0) {
    local_5c = 0;
  }
  else {
    _Var10 = s390_has_feat(env->uc,S390_FEAT_EDAT);
    local_5c = (undefined4)CONCAT71(extraout_var,_Var10);
  }
  if ((char)local_5c == '\0') {
    local_40 = (FlatView *)((ulong)local_40._4_4_ << 0x20);
  }
  else {
    _Var10 = s390_has_feat(env->uc,S390_FEAT_EDAT_2);
    local_40 = (FlatView *)CONCAT44(local_40._4_4_,(int)CONCAT71(extraout_var_00,_Var10));
  }
  bVar11 = true;
  if ((env->cregs[0] & 0x100000) != 0) {
    _Var10 = s390_has_feat(env->uc,S390_FEAT_INSTRUCTION_EXEC_PROT);
    bVar11 = !_Var10;
  }
  local_38 = raddr;
  if ((uVar18 & 0x20) != 0) goto LAB_00cc5631;
  uVar16 = (uint)uVar18 & 3;
  uVar20 = (uint)(uVar18 >> 2) & 3;
  uVar17 = (uint)(vaddr >> 0x20);
  switch(uVar20) {
  case 0:
    if (0x7fffffff < vaddr) {
LAB_00cc5121:
      iVar23 = 0x38;
      break;
    }
    sVar15 = 0x11;
    if (vaddr >> 0x1d <= (ulong)uVar16) goto LAB_00cc507a;
LAB_00cc52db:
    iVar23 = 0x10;
    break;
  case 1:
    if (vaddr >> 0x2a != 0) goto LAB_00cc5121;
    sVar15 = 0x1c;
    if (uVar17 >> 8 <= uVar16) goto LAB_00cc507a;
LAB_00cc563b:
    iVar23 = 0x3b;
    break;
  case 2:
    if (vaddr >> 0x35 != 0) goto LAB_00cc5121;
    sVar15 = 0x27;
    if (uVar17 >> 0x13 <= uVar16) goto LAB_00cc507a;
LAB_00cc5549:
    iVar23 = 0x3a;
    break;
  case 3:
    sVar15 = 0x32;
    if (uVar16 < uVar17 >> 0x1e) {
LAB_00cc5411:
      iVar23 = 0x39;
      break;
    }
LAB_00cc507a:
    addr = (ulong)((uint)(vaddr >> sVar15) & 0x3ff8) + (uVar18 & 0xfffffffffffff000);
    switch(uVar20) {
    case 1:
switchD_00cc50a6_caseD_1:
      lVar19 = *(long *)(env[-0x1e].aregs + 2);
      local_48 = *(FlatView **)(lVar19 + 8);
      l = 8;
      pMVar13 = flatview_translate_s390x
                          (*(uc_struct_conflict14 **)(lVar19 + 0x30),local_48,addr,&local_68,&l,
                           false,(MemTxAttrs)0x1);
      if ((l == 8) && (pMVar13->ram == true)) {
        puVar14 = (ulong *)qemu_map_ram_ptr_s390x
                                     ((uc_struct_conflict14 *)pMVar13->uc,pMVar13->ram_block,
                                      local_68);
        local_70 = *puVar14;
      }
      else {
        MVar12 = flatview_read_continue_s390x
                           (*(uc_struct_conflict14 **)(lVar19 + 0x30),local_48,addr,(MemTxAttrs)0x1,
                            &local_70,8,local_68,l,pMVar13);
        if (MVar12 != 0) goto LAB_00cc5774;
      }
      uVar1 = local_70 >> 0x38;
      uVar2 = (local_70 & 0xff000000000000) >> 0x28;
      uVar3 = (local_70 & 0xff0000000000) >> 0x18;
      uVar4 = (local_70 & 0xff00000000) >> 8;
      uVar22 = uVar1 | uVar2 | uVar3 | uVar4;
      uVar5 = (local_70 & 0xff000000) << 8;
      uVar6 = (local_70 & 0xff0000) << 0x18;
      uVar7 = (local_70 & 0xff00) << 0x28;
      uVar8 = local_70 << 0x38;
      local_70 = uVar22 | uVar5 | uVar6 | uVar7 | uVar8;
      if ((uVar1 & 0x20) != 0) goto LAB_00cc563b;
      uVar17 = (uint)uVar22;
      iVar23 = 0x12;
      if (((uVar17 & 0xc) != 4) ||
         (((char)local_40 != '\0' && (((uint)(uVar18 >> 8) & 0xffffff & (uVar17 & 0x10) >> 4) != 0))
         )) goto LAB_00cc5649;
      if ((char)local_5c == '\x01' && (uVar17 >> 9 & 1) != 0) {
        *local_58 = *local_58 & 0xfd;
      }
      if ((char)local_40 == '\x01' && (uVar17 >> 10 & 1) != 0) {
        if (!bVar11 && (uVar17 >> 8 & 1) != 0) {
          *local_58 = *local_58 & 0xfb;
        }
        uVar22 = (ulong)(uVar21 & 0x7ffff000) |
                 uVar4 & 0xffffffff80000000 | uVar5 | uVar6 | uVar7 | uVar8;
        goto LAB_00cc5631;
      }
      uVar16 = (uint)(vaddr >> 0x1d) & 3;
      bVar9 = false;
      iVar23 = 0x10;
      if (((uVar17 & 3) < uVar16) || (uVar16 < ((uint)(uVar22 >> 6) & 3))) goto LAB_00cc564b;
      addr = (ulong)((uint)(vaddr >> 0x11) & 0x3ff8) +
             (uVar2 & 0xfffffffffffff000 | uVar3 | uVar4 | uVar5 | uVar6 | uVar7 | uVar8);
      break;
    case 2:
switchD_00cc50a6_caseD_2:
      lVar19 = *(long *)(env[-0x1e].aregs + 2);
      local_48 = *(FlatView **)(lVar19 + 8);
      l = 8;
      pMVar13 = flatview_translate_s390x
                          (*(uc_struct_conflict14 **)(lVar19 + 0x30),local_48,addr,&local_68,&l,
                           false,(MemTxAttrs)0x1);
      if ((l == 8) && (pMVar13->ram == true)) {
        puVar14 = (ulong *)qemu_map_ram_ptr_s390x
                                     ((uc_struct_conflict14 *)pMVar13->uc,pMVar13->ram_block,
                                      local_68);
        local_70 = *puVar14;
      }
      else {
        MVar12 = flatview_read_continue_s390x
                           (*(uc_struct_conflict14 **)(lVar19 + 0x30),local_48,addr,(MemTxAttrs)0x1,
                            &local_70,8,local_68,l,pMVar13);
        if (MVar12 != 0) goto LAB_00cc5774;
      }
      uVar22 = local_70 >> 0x38;
      uVar2 = (local_70 & 0xff000000000000) >> 0x28;
      uVar3 = (local_70 & 0xff0000000000) >> 0x18;
      uVar4 = (local_70 & 0xff00000000) >> 8;
      uVar1 = uVar22 | uVar2 | uVar3 | uVar4;
      uVar5 = (local_70 & 0xff000000) << 8;
      uVar6 = (local_70 & 0xff0000) << 0x18;
      uVar7 = (local_70 & 0xff00) << 0x28;
      uVar8 = local_70 << 0x38;
      local_70 = uVar1 | uVar5 | uVar6 | uVar7 | uVar8;
      if ((uVar22 & 0x20) != 0) goto LAB_00cc5549;
      uVar16 = (uint)uVar1;
      if ((uVar16 & 0xc) != 8) goto LAB_00cc5643;
      uVar17 = uVar17 >> 8 & 3;
      bVar9 = false;
      iVar23 = 0x3b;
      if ((uVar17 <= (uVar16 & 3)) && (((uint)(uVar1 >> 6) & 3) <= uVar17)) {
        if ((char)local_5c == '\x01' && (uVar16 >> 9 & 1) != 0) {
          *local_58 = *local_58 & 0xfd;
        }
        addr = (ulong)((uint)(vaddr >> 0x1c) & 0x3ff8) +
               (uVar2 & 0xfffffffffffff000 | uVar3 | uVar4 | uVar5 | uVar6 | uVar7 | uVar8);
        goto switchD_00cc50a6_caseD_1;
      }
      goto LAB_00cc564b;
    case 3:
      lVar19 = *(long *)(env[-0x1e].aregs + 2);
      local_48 = *(FlatView **)(lVar19 + 8);
      l = 8;
      pMVar13 = flatview_translate_s390x
                          (*(uc_struct_conflict14 **)(lVar19 + 0x30),local_48,addr,&local_68,&l,
                           false,(MemTxAttrs)0x1);
      if ((l == 8) && (pMVar13->ram == true)) {
        puVar14 = (ulong *)qemu_map_ram_ptr_s390x
                                     ((uc_struct_conflict14 *)pMVar13->uc,pMVar13->ram_block,
                                      local_68);
        local_70 = *puVar14;
LAB_00cc531f:
        uVar22 = local_70 >> 0x38;
        uVar2 = (local_70 & 0xff000000000000) >> 0x28;
        uVar3 = (local_70 & 0xff0000000000) >> 0x18;
        uVar4 = (local_70 & 0xff00000000) >> 8;
        uVar1 = uVar22 | uVar2 | uVar3 | uVar4;
        uVar5 = (local_70 & 0xff000000) << 8;
        uVar6 = (local_70 & 0xff0000) << 0x18;
        uVar7 = (local_70 & 0xff00) << 0x28;
        uVar8 = local_70 << 0x38;
        local_70 = uVar1 | uVar5 | uVar6 | uVar7 | uVar8;
        if ((uVar22 & 0x20) != 0) goto LAB_00cc5411;
        uVar16 = (uint)uVar1;
        if ((~uVar16 & 0xc) == 0) {
          uVar20 = uVar17 >> 0x13 & 3;
          bVar9 = false;
          iVar23 = 0x3a;
          if ((uVar20 <= (uVar16 & 3)) && (((uint)(uVar1 >> 6) & 3) <= uVar20)) {
            if ((char)local_5c == '\x01' && (uVar16 >> 9 & 1) != 0) {
              *local_58 = *local_58 & 0xfd;
            }
            addr = (ulong)(uVar17 >> 7 & 0x3ff8) +
                   (uVar2 & 0xfffffffffffff000 | uVar3 | uVar4 | uVar5 | uVar6 | uVar7 | uVar8);
            goto switchD_00cc50a6_caseD_2;
          }
          goto LAB_00cc564b;
        }
LAB_00cc5643:
        iVar23 = 0x12;
        goto LAB_00cc5649;
      }
      MVar12 = flatview_read_continue_s390x
                         (*(uc_struct_conflict14 **)(lVar19 + 0x30),local_48,addr,(MemTxAttrs)0x1,
                          &local_70,8,local_68,l,pMVar13);
      if (MVar12 == 0) goto LAB_00cc531f;
      goto LAB_00cc5774;
    }
    lVar19 = *(long *)(env[-0x1e].aregs + 2);
    local_40 = *(FlatView **)(lVar19 + 8);
    l = 8;
    pMVar13 = flatview_translate_s390x
                        (*(uc_struct_conflict14 **)(lVar19 + 0x30),local_40,addr,&local_68,&l,false,
                         (MemTxAttrs)0x1);
    if ((l == 8) && (pMVar13->ram == true)) {
      puVar14 = (ulong *)qemu_map_ram_ptr_s390x
                                   ((uc_struct_conflict14 *)pMVar13->uc,pMVar13->ram_block,local_68)
      ;
      local_70 = *puVar14;
LAB_00cc5251:
      uVar22 = local_70 >> 0x38;
      uVar2 = (local_70 & 0xff000000000000) >> 0x28;
      uVar3 = (local_70 & 0xff0000000000) >> 0x18;
      uVar4 = (local_70 & 0xff00000000) >> 8;
      uVar1 = uVar22 | uVar2 | uVar3 | uVar4;
      uVar5 = (local_70 & 0xff000000) << 8;
      uVar6 = (local_70 & 0xff0000) << 0x18;
      uVar7 = (local_70 & 0xff00) << 0x28;
      uVar8 = local_70 << 0x38;
      local_70 = uVar1 | uVar5 | uVar6 | uVar7 | uVar8;
      if ((uVar22 & 0x20) != 0) goto LAB_00cc52db;
      iVar23 = 0x12;
      if (((uVar22 & 0xc) == 0) &&
         (uVar17 = (uint)uVar1, ((uint)uVar18 >> 8 & (uVar17 & 0x10) >> 4) == 0)) {
        if ((uVar17 >> 9 & 1) != 0) {
          *local_58 = *local_58 & 0xfd;
        }
        if ((char)local_5c == '\x01' && (uVar17 >> 10 & 1) != 0) {
          if (!bVar11 && (uVar17 >> 8 & 1) != 0) {
            *local_58 = *local_58 & 0xfb;
          }
          uVar22 = (ulong)(uVar21 & 0xff000) |
                   uVar3 & 0xfffffffffff00000 | uVar4 | uVar5 | uVar6 | uVar7 | uVar8;
LAB_00cc5631:
          *local_38 = uVar22;
          iVar23 = 0;
          bVar9 = true;
          goto LAB_00cc564b;
        }
        _Var10 = read_table_entry(env,(ulong)(uVar21 >> 9 & 0x7f8) |
                                      uVar2 & 0xfffffffffffff800 | uVar3 | uVar4 | uVar5 | uVar6 |
                                      uVar7 | uVar8,&local_70);
        if (_Var10) {
          uVar21 = (uint)local_70;
          if ((uVar21 >> 10 & 1) == 0) {
            if ((uVar21 >> 0xb & 1) == 0) {
              if ((uVar21 >> 9 & 1) != 0) {
                *local_58 = *local_58 & 0xfd;
              }
              if (!bVar11 && (uVar21 >> 8 & 1) != 0) {
                *local_58 = *local_58 & 0xfb;
              }
              uVar22 = local_70 & 0xfffffffffffff000;
              goto LAB_00cc5631;
            }
          }
          else {
            iVar23 = 0x11;
          }
        }
        else {
          iVar23 = 5;
        }
      }
      break;
    }
    MVar12 = flatview_read_continue_s390x
                       (*(uc_struct_conflict14 **)(lVar19 + 0x30),local_40,addr,(MemTxAttrs)0x1,
                        &local_70,8,local_68,l,pMVar13);
    if (MVar12 == 0) goto LAB_00cc5251;
LAB_00cc5774:
    bVar9 = false;
    iVar23 = 5;
    goto LAB_00cc564b;
  }
LAB_00cc5649:
  bVar9 = false;
LAB_00cc564b:
  if (!bVar9) {
    return iVar23;
  }
  if ((rw == 1) && ((*local_58 & 2) == 0)) {
    *(byte *)tec = (byte)*tec | 4;
  }
  else {
    if ((rw != 2) || ((*local_58 & 4) != 0)) {
LAB_00cc5673:
      mmu_translate_cold_1();
      return 0;
    }
    *(byte *)tec = (byte)*tec | 0x84;
  }
  return 4;
}

Assistant:

int mmu_translate(CPUS390XState *env, target_ulong vaddr, int rw, uint64_t asc,
                  target_ulong *raddr, int *flags, uint64_t *tec)
{
    uint64_t asce;
    int r;

    *tec = (vaddr & TARGET_PAGE_MASK) | (asc >> 46) |
            (rw == MMU_DATA_STORE ? FS_WRITE : FS_READ);
    *flags = PAGE_READ | PAGE_WRITE | PAGE_EXEC;

    if (is_low_address(vaddr & TARGET_PAGE_MASK) && lowprot_enabled(env, asc)) {
        /*
         * If any part of this page is currently protected, make sure the
         * TLB entry will not be reused.
         *
         * As the protected range is always the first 512 bytes of the
         * two first pages, we are able to catch all writes to these areas
         * just by looking at the start address (triggering the tlb miss).
         */
        *flags |= PAGE_WRITE_INV;
        if (is_low_address(vaddr) && rw == MMU_DATA_STORE) {
            /* LAP sets bit 56 */
            *tec |= 0x80;
            return PGM_PROTECTION;
        }
    }

    vaddr &= TARGET_PAGE_MASK;

    if (!(env->psw.mask & PSW_MASK_DAT)) {
        *raddr = vaddr;
        goto nodat;
    }

    switch (asc) {
    case PSW_ASC_PRIMARY:
        asce = env->cregs[1];
        break;
    case PSW_ASC_HOME:
        asce = env->cregs[13];
        break;
    case PSW_ASC_SECONDARY:
        asce = env->cregs[7];
        break;
    case PSW_ASC_ACCREG:
    default:
        // hw_error("guest switched to unknown asc mode\n");
        break;
    }

    /* perform the DAT translation */
    r = mmu_translate_asce(env, vaddr, asc, asce, raddr, flags, rw);
    if (unlikely(r)) {
        return r;
    }

    /* check for DAT protection */
    if (unlikely(rw == MMU_DATA_STORE && !(*flags & PAGE_WRITE))) {
        /* DAT sets bit 61 only */
        *tec |= 0x4;
        return PGM_PROTECTION;
    }

    /* check for Instruction-Execution-Protection */
    if (unlikely(rw == MMU_INST_FETCH && !(*flags & PAGE_EXEC))) {
        /* IEP sets bit 56 and 61 */
        *tec |= 0x84;
        return PGM_PROTECTION;
    }

nodat:
    /* Convert real address -> absolute address */
    *raddr = mmu_real2abs(env, *raddr);

    mmu_handle_skey(env->uc, *raddr, rw, flags);
    return 0;
}